

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

int __thiscall MlmWrap::initialize(MlmWrap *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *_id;
  pointer pcVar2;
  int iVar3;
  zactor_t *pzVar4;
  ostream *poVar5;
  _Alloc_hider _Var6;
  TrodesMsg configReq;
  TrodesMsg local_f0;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if (this->connected == false) {
    _id = (this->id)._M_dataplus._M_p;
    paVar1 = &local_f0.format.field_2;
    pcVar2 = (this->state->endpoint)._M_dataplus._M_p;
    local_f0.format._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar2,pcVar2 + (this->state->endpoint)._M_string_length);
    create(this,_id,local_f0.format._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.format._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0.format._M_dataplus._M_p,
                      local_f0.format.field_2._M_allocated_capacity + 1);
    }
    if (this->connected == false) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Client could not be initialized!","");
      error(&local_f0.format,this,&local_48);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_f0.format._M_dataplus._M_p,
                          local_f0.format._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0.format._M_dataplus._M_p != paVar1) {
        operator_delete(local_f0.format._M_dataplus._M_p,
                        local_f0.format.field_2._M_allocated_capacity + 1);
      }
      _Var6._M_p = local_48._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return -1;
      }
      goto LAB_001810d0;
    }
  }
  if (this->initialized != false) {
    return 0;
  }
  pzVar4 = zactor_new(message_reactor_task,this);
  this->actor = pzVar4;
  if ((pzVar4 != (zactor_t *)0x0) && (this->client != (mlm_client_t *)0x0)) {
    this->initialized = true;
    iVar3 = std::__cxx11::string::compare((char *)&this->id);
    if (iVar3 == 0) {
      return 0;
    }
    iVar3 = std::__cxx11::string::compare((char *)&this->id);
    if (iVar3 != 0) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"s","");
      TrodesMsg::TrodesMsg<char_const*>(&local_f0,&local_68,"infoConf");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      sendMessage(this,"Trodes","info_req",&local_f0,"",0);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"infoConf","");
      blockforreply(this,&local_88,500);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      TrodesMsg::~TrodesMsg(&local_f0);
      return 0;
    }
    return 0;
  }
  if (pzVar4 != (zactor_t *)0x0) {
    zactor_destroy(&this->actor);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"Client could not be initialized!","");
    error(&local_f0.format,this,&local_a8);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_f0.format._M_dataplus._M_p,
                        local_f0.format._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.format._M_dataplus._M_p != &local_f0.format.field_2) {
      operator_delete(local_f0.format._M_dataplus._M_p,
                      local_f0.format.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    return -2;
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"Client could not be initialized!","");
  error(&local_f0.format,this,&local_c8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_f0.format._M_dataplus._M_p,
                      local_f0.format._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.format._M_dataplus._M_p != &local_f0.format.field_2) {
    operator_delete(local_f0.format._M_dataplus._M_p,
                    local_f0.format.field_2._M_allocated_capacity + 1);
  }
  local_48.field_2._M_allocated_capacity = local_c8.field_2._M_allocated_capacity;
  _Var6._M_p = local_c8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
    return -1;
  }
LAB_001810d0:
  operator_delete(_Var6._M_p,local_48.field_2._M_allocated_capacity + 1);
  return -1;
}

Assistant:

int MlmWrap::initialize(){
    if (!connected){ //if the broker could not be connected to, try again once
        create(id.c_str(), state->getEndpoint().c_str());
        if(!connected){
            std::cerr << error("Client could not be initialized!") << std::endl;
            return -1;
        }
    }

    if(initialized){
        return 0;
    }
    actor = zactor_new(&MlmWrap::message_reactor_task, this);
    if(actor && client){ //both actor and client must be successfully created
        initialized = true;
        if (id != TRODES_NETWORK_ID && id != BROKER_NETWORK_ID) {
            //Request from Trodes the current state object (events, hfdts, and others)
            TrodesMsg configReq("s", INFO_CONFIG);
            sendMessage(TRODES_NETWORK_ID, TRODES_INFO_REQ, configReq);
            blockforreply(INFO_CONFIG, 500);
        }
        return 0;
    }
    else if (actor != NULL) {
        zactor_destroy(&actor);
        std::cerr << error("Client could not be initialized!") << std::endl;
        return -2;
    }
    else{
        std::cerr << error("Client could not be initialized!") << std::endl;
        return -1;
    }
}